

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

stb_vorbis * stb_vorbis_open_filename(char *filename,int *error,stb_vorbis_alloc *alloc)

{
  FAudioIOStream *alloc_00;
  int *in_RDX;
  undefined4 *in_RSI;
  FAudioIOStream *in_RDI;
  FAudioIOStream *f;
  undefined8 local_8;
  
  alloc_00 = FAudio_fopen((char *)in_RDX);
  if (alloc_00 == (FAudioIOStream *)0x0) {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = 6;
    }
    local_8 = (stb_vorbis *)0x0;
  }
  else {
    local_8 = stb_vorbis_open_file
                        (in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,(stb_vorbis_alloc *)alloc_00);
  }
  return local_8;
}

Assistant:

stb_vorbis * stb_vorbis_open_filename(const char *filename, int *error, const stb_vorbis_alloc *alloc)
{
   FILE *f;
#if defined(_WIN32) && defined(__STDC_WANT_SECURE_LIB__)
   if (0 != fopen_s(&f, filename, "rb"))
      f = NULL;
#else
   f = fopen(filename, "rb");
#endif
   if (f)
      return stb_vorbis_open_file(f, TRUE, error, alloc);
   if (error) *error = VORBIS_file_open_failure;
   return NULL;
}